

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

int NGA_Create_ghosts(int type,int ndim,int *dims,int *width,char *name,int *chunk)

{
  logical lVar1;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_R9;
  int i_2;
  int i_1;
  int i;
  Integer _ga_width [7];
  Integer _ga_work [7];
  Integer _ga_dims [7];
  logical st;
  Integer g_a;
  Integer *ptr;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  int iVar2;
  int iVar3;
  Integer *in_stack_fffffffffffffef8;
  Integer *in_stack_ffffffffffffff00;
  Integer in_stack_ffffffffffffff08;
  Integer in_stack_ffffffffffffff10;
  Integer *in_stack_ffffffffffffff20;
  long local_c8 [8];
  long local_88 [9];
  int local_40;
  long *local_38;
  long local_30;
  long local_20;
  long local_18;
  int local_c;
  int local_4;
  
  if (in_ESI < 8) {
    local_30 = in_R9;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_c = in_ESI;
    for (iVar3 = 0; iVar3 < local_c; iVar3 = iVar3 + 1) {
      local_88[(local_c - iVar3) + -1] = (long)*(int *)(local_18 + (long)iVar3 * 4);
    }
    for (iVar2 = 0; iVar2 < local_c; iVar2 = iVar2 + 1) {
      *(long *)(&stack0xfffffffffffffef8 + (long)((local_c - iVar2) + -1) * 8) =
           (long)*(int *)(local_20 + (long)iVar2 * 4);
    }
    if (local_30 == 0) {
      local_38 = (long *)0x0;
    }
    else {
      for (in_stack_fffffffffffffeec = 0; in_stack_fffffffffffffeec < local_c;
          in_stack_fffffffffffffeec = in_stack_fffffffffffffeec + 1) {
        local_c8[(local_c - in_stack_fffffffffffffeec) + -1] =
             (long)*(int *)(local_30 + (long)in_stack_fffffffffffffeec * 4);
      }
      local_38 = local_c8;
    }
    lVar1 = pnga_create_ghosts(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                               in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                               (char *)CONCAT44(iVar3,iVar2),
                               (Integer *)
                               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                               in_stack_ffffffffffffff20);
    if (lVar1 == 1) {
      local_4 = local_40;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int NGA_Create_ghosts(int type, int ndim,int dims[], int width[], char *name,
    int chunk[])
{
    Integer *ptr, g_a; 
    logical st;
    Integer _ga_dims[MAXDIM];
    Integer _ga_work[MAXDIM];
    Integer _ga_width[MAXDIM];
    if(ndim>MAXDIM)return 0;

    COPYC2F(dims,_ga_dims, ndim);
    COPYC2F(width,_ga_width, ndim);
    if(!chunk)ptr=(Integer*)0;  
    else {
         COPYC2F(chunk,_ga_work, ndim);
         ptr = _ga_work;
    }
    st = wnga_create_ghosts((Integer)type, (Integer)ndim, _ga_dims,
        _ga_width, name, ptr, &g_a);
    if(st==TRUE) return (int) g_a;
    else return 0;
}